

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void array_uc(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  Assert local_1c0 [2];
  outputter<unsigned_char[4]> local_1a0;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [380];
  uchar local_c [2] [4];
  uchar s [4];
  
  local_c[0][0] = '\0';
  local_c[0][1] = '\x01';
  local_c[0][2] = '\x02';
  local_c[0][3] = 0x9c;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = UnitTests::stream_any<unsigned_char[4]>(local_c);
  UnitTests::stream_any_details::operator<<(local_188,&local_1a0);
  UnitTests::Assert::Assert
            (local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,199);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[25],std::__cxx11::string>
            (local_1c0,(char (*) [25])"[0x00, 0x01, 0x02, 0x9c]",local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(array_uc)
{
    unsigned char s[]{0, 1, 2, 156};
    auto          ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0x00, 0x01, 0x02, 0x9c]", ss.str());
}